

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult
aa64_cacheop_poc_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if (iVar1 != 1) {
    if (iVar1 != 0) {
      return CP_ACCESS_OK;
    }
    uVar2 = arm_sctlr_aarch64(env,0);
    if (((uint)uVar2 >> 0x1a & 1) == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  uVar2 = arm_hcr_el2_eff_aarch64(env);
  if (((uint)uVar2 >> 0x17 & 1) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL2;
}

Assistant:

static CPAccessResult aa64_cacheop_poc_access(CPUARMState *env,
                                              const ARMCPRegInfo *ri,
                                              bool isread)
{
    /* Cache invalidate/clean to Point of Coherency or Persistence...  */
    switch (arm_current_el(env)) {
    case 0:
        /* ... EL0 must UNDEF unless SCTLR_EL1.UCI is set.  */
        if (!(arm_sctlr(env, 0) & SCTLR_UCI)) {
            return CP_ACCESS_TRAP;
        }
        /* fall through */
    case 1:
        /* ... EL1 must trap to EL2 if HCR_EL2.TPCP is set.  */
        if (arm_hcr_el2_eff(env) & HCR_TPCP) {
            return CP_ACCESS_TRAP_EL2;
        }
        break;
    }
    return CP_ACCESS_OK;
}